

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_DateTimeStruct * UA_DateTime_toStruct(UA_DateTimeStruct *__return_storage_ptr__,UA_DateTime t)

{
  UA_DateTimeStruct *dateTimeStruct;
  undefined1 local_50 [8];
  tm ts;
  time_t secSinceUnixEpoch;
  UA_DateTime t_local;
  
  __return_storage_ptr__->nanoSec = (short)(t % 10) * 100;
  __return_storage_ptr__->microSec = (UA_UInt16)((t % 10000) / 10);
  __return_storage_ptr__->milliSec = (UA_UInt16)((t % 10000000) / 10000);
  ts.tm_zone = (char *)((t + -0x19db1ded53e8000) / 10000000);
  memset(local_50,0,0x38);
  __secs_to_tm((longlong)ts.tm_zone,(tm *)local_50);
  __return_storage_ptr__->sec = local_50._0_2_;
  __return_storage_ptr__->min = local_50._4_2_;
  __return_storage_ptr__->hour = (UA_UInt16)ts.tm_sec;
  __return_storage_ptr__->day = (UA_UInt16)ts.tm_min;
  __return_storage_ptr__->month = (short)ts.tm_hour + 1;
  __return_storage_ptr__->year = (short)ts.tm_mday + 0x76c;
  return __return_storage_ptr__;
}

Assistant:

UA_DateTimeStruct
UA_DateTime_toStruct(UA_DateTime t) {
    /* Calculating the the milli-, micro- and nanoseconds */
    UA_DateTimeStruct dateTimeStruct;
    dateTimeStruct.nanoSec  = (UA_UInt16)((t % 10) * 100);
    dateTimeStruct.microSec = (UA_UInt16)((t % 10000) / 10);
    dateTimeStruct.milliSec = (UA_UInt16)((t % 10000000) / 10000);

    /* Calculating the unix time with #include <time.h> */
    time_t secSinceUnixEpoch =
        (time_t)((t - UA_DATETIME_UNIX_EPOCH) / UA_SEC_TO_DATETIME);
    struct tm ts;
    memset(&ts, 0, sizeof(struct tm));
    __secs_to_tm(secSinceUnixEpoch, &ts);
    dateTimeStruct.sec    = (UA_UInt16)ts.tm_sec;
    dateTimeStruct.min    = (UA_UInt16)ts.tm_min;
    dateTimeStruct.hour   = (UA_UInt16)ts.tm_hour;
    dateTimeStruct.day    = (UA_UInt16)ts.tm_mday;
    dateTimeStruct.month  = (UA_UInt16)(ts.tm_mon + 1);
    dateTimeStruct.year   = (UA_UInt16)(ts.tm_year + 1900);
    return dateTimeStruct;
}